

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_freeze(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *o_00;
  SQObjectPtr dst;
  SQObjectPtr *o;
  SQInteger in_stack_ffffffffffffffb8;
  HSQUIRRELVM in_stack_ffffffffffffffc0;
  HSQUIRRELVM in_stack_ffffffffffffffc8;
  SQObjectType in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SQRESULT local_8;
  
  o_00 = stack_get(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar1 = validate_freezable(in_stack_ffffffffffffffc8,(SQObjectPtr *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffd0,o_00);
    SQVM::Push((SQVM *)(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0) | 0x100000000)
               ,(SQObjectPtr *)in_stack_ffffffffffffffc8);
    local_8 = 0;
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffc0);
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQRESULT sq_freeze(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    if (!validate_freezable(v, o))
        return SQ_ERROR;

    SQObjectPtr dst = o;
    dst._flags |= SQOBJ_FLAG_IMMUTABLE;
    v->Push(dst);
    return SQ_OK;
}